

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_change_event_drain_all_Test::TestBody(Buffer_change_event_drain_all_Test *this)

{
  void *pvVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  initializer_list<bfy_changed_cb_info> __l;
  size_t size;
  BufferWithReadonlyStrings local;
  allocator_type local_119;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  pointer local_108;
  AssertHelper local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  bfy_changed_cb_info local_f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  BufferWithReadonlyStrings local_d0;
  
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_d0);
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           bfy_buffer_get_content_len(&local_d0.buf);
  local_d8._M_head_impl = pbVar2;
  bfy_buffer_set_changed_cb
            (&local_d0.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_d0.changes);
  local_f0.orig_size = bfy_buffer_drain_all(&local_d0.buf);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_118,"size","bfy_buffer_drain_all(&local.buf)",
             (unsigned_long *)&local_d8,&local_f0.orig_size);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5d4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((long *)local_f0.orig_size != (long *)0x0) {
      (**(code **)(*(long *)local_f0.orig_size + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_f0.n_added = 0;
  __l._M_len = 1;
  __l._M_array = &local_f0;
  local_f0.orig_size = (size_t)pbVar2;
  local_f0.n_deleted = (size_t)pbVar2;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_118,__l,
             &local_119);
  testing::internal::
  CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
            ((internal *)&local_100,"changes_t{expected}","local.changes",
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_118,
             &local_d0.changes);
  pvVar1 = (void *)CONCAT71(local_118._1_7_,local_118[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_108 - (long)pvVar1);
  }
  if (local_100.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_118);
    if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5d5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((long *)CONCAT71(local_118._1_7_,local_118[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_118._1_7_,local_118[0]) + 8))();
    }
  }
  if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,local_f8);
  }
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_d0);
  return;
}

Assistant:

TEST(Buffer, change_event_drain_all) {
    BufferWithReadonlyStrings local;
    auto const size = bfy_buffer_get_content_len(&local.buf);
    auto const expected = bfy_changed_cb_info {
        .orig_size = size,
        .n_added = 0,
        .n_deleted = size
    };

    local.start_listening_to_changes();
    EXPECT_EQ(size, bfy_buffer_drain_all(&local.buf));
    EXPECT_EQ(changes_t{expected}, local.changes);
}